

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O2

void __thiscall mocker::Annotator::operator()(Annotator *this,FuncDecl *node)

{
  __shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  __shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<mocker::ast::VarDeclStmt> *param;
  __shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2> *__r;
  __shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2> *__r_00;
  __shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> local_a0 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  ScopeID scopeIntroduced;
  __shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2> local_70;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  if ((node->retType).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Type,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&scopeIntroduced,
               &(node->retType).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>);
    visit(this,(shared_ptr<mocker::ast::ASTNode> *)&scopeIntroduced);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &scopeIntroduced.ids.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  SymTbl::createSubscope(&scopeIntroduced,&this->ctx->syms,&this->scopeResiding);
  p_Var1 = &((node->formalParameters).
             super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>;
  for (__r = &((node->formalParameters).
               super__Vector_base<std::shared_ptr<mocker::ast::VarDeclStmt>,_std::allocator<std::shared_ptr<mocker::ast::VarDeclStmt>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->
              super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>;
      __r != p_Var1; __r = __r + 1) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::VarDeclStmt,void>(local_a0,__r);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
               &scopeIntroduced.ids);
    visit(this,(shared_ptr<mocker::ast::ASTNode> *)local_a0,(ScopeID *)&local_48);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  }
  peVar2 = (node->body).super___shared_ptr<mocker::ast::CompoundStmt,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var3 = &((peVar2->stmts).
             super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>;
  for (__r_00 = &((peVar2->stmts).
                  super__Vector_base<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<mocker::ast::Statement,_(__gnu_cxx::_Lock_policy)2>;
      __r_00 != p_Var3; __r_00 = __r_00 + 1) {
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::Statement,void>(local_a0,__r_00);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_60,
               &scopeIntroduced.ids);
    std::__shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,
               &(node->retType).super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>);
    visit(this,(shared_ptr<mocker::ast::ASTNode> *)local_a0,(ScopeID *)&local_60,false,true,
          (shared_ptr<mocker::ast::Type> *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_60);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&scopeIntroduced);
  return;
}

Assistant:

void operator()(ast::FuncDecl &node) const override {
    if (node.retType)
      visit(node.retType);

    auto scopeIntroduced = ctx.syms.createSubscope(scopeResiding);

    for (const auto &param : node.formalParameters)
      visit(param, scopeIntroduced);

    for (auto &stmt : node.body->stmts)
      visit(stmt, scopeIntroduced, false, true, node.retType);
  }